

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O2

void __thiscall SocketLog::disconnectAllStreams(SocketLog *this)

{
  pointer ppTVar1;
  TCPStream *this_00;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int in_R8D;
  pointer ppTVar2;
  
  std::mutex::lock(&this->streamMutex);
  ppTVar1 = (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  __buf = extraout_RDX;
  for (ppTVar2 = (this->connectedStreams).
                 super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    this_00 = *ppTVar2;
    TCPStream::send(this_00,0x10612a,__buf,in_RCX,in_R8D);
    TCPStream::~TCPStream(this_00);
    operator_delete(this_00);
    __buf = extraout_RDX_00;
  }
  ppTVar2 = (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppTVar2) {
    (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex);
  return;
}

Assistant:

void SocketLog::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex);

    for(auto stream:connectedStreams) {
        stream->send("SocketLog say Bye!\n");
        delete stream;
    }
    connectedStreams.clear();
}